

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSet::serialize(UnicodeSet *this,uint16_t *dest,int32_t destCapacity,UErrorCode *ec)

{
  uint16_t uVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  long lVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar3 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (dest == (uint16_t *)0x0 && destCapacity != 0)) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      return iVar3;
    }
    iVar2 = this->len;
    uVar8 = iVar2 - 1;
    if (uVar8 == 0) {
      if (destCapacity == 0) {
        *ec = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *dest = 0;
      }
      return 1;
    }
    puVar7 = (uint16_t *)this->list;
    uVar9 = uVar8;
    if (0xffff < *(int *)(puVar7 + (long)iVar2 * 2 + -4)) {
      if (*(int *)puVar7 < 0x10000) {
        uVar10 = 0;
        if (1 < iVar2) {
          uVar10 = 0;
          do {
            if (0xffff < *(int *)(puVar7 + uVar10 * 2)) goto LAB_001a2b34;
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
          uVar10 = (ulong)uVar8;
        }
LAB_001a2b34:
        iVar2 = uVar8 * 2;
        uVar8 = (uint)uVar10;
        uVar9 = iVar2 - (uint)uVar10;
      }
      else {
        uVar9 = uVar8 * 2;
        uVar8 = 0;
      }
    }
    if (0x7fff < (int)uVar9) {
      *ec = U_INDEX_OUTOFBOUNDS_ERROR;
      return iVar3;
    }
    iVar3 = ((int)uVar8 < (int)uVar9) + uVar9 + 1;
    if (destCapacity < iVar3) {
      *ec = U_BUFFER_OVERFLOW_ERROR;
      return iVar3;
    }
    *dest = (ushort)uVar9;
    if ((int)uVar8 < (int)uVar9) {
      *dest = (ushort)uVar9 | 0x8000;
      dest[1] = (uint16_t)uVar8;
      dest = dest + 1;
    }
    puVar6 = dest + 1;
    uVar4 = uVar8;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    else {
      do {
        uVar1 = *puVar7;
        puVar7 = puVar7 + 2;
        *puVar6 = uVar1;
        puVar6 = puVar6 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    if ((int)uVar8 < (int)uVar9) {
      lVar5 = 0;
      do {
        *(uint *)(puVar6 + lVar5) =
             *(uint *)(puVar7 + lVar5) >> 0x10 | *(uint *)(puVar7 + lVar5) << 0x10;
        lVar5 = lVar5 + 2;
      } while ((int)(uVar8 + (int)lVar5) < (int)uVar9);
    }
  }
  return iVar3;
}

Assistant:

int32_t UnicodeSet::serialize(uint16_t *dest, int32_t destCapacity, UErrorCode& ec) const {
    int32_t bmpLength, length, destLength;

    if (U_FAILURE(ec)) {
        return 0;
    }

    if (destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        ec=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* count necessary 16-bit units */
    length=this->len-1; // Subtract 1 to ignore final UNICODESET_HIGH
    // assert(length>=0);
    if (length==0) {
        /* empty set */
        if (destCapacity>0) {
            *dest=0;
        } else {
            ec=U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }
    /* now length>0 */

    if (this->list[length-1]<=0xffff) {
        /* all BMP */
        bmpLength=length;
    } else if (this->list[0]>=0x10000) {
        /* all supplementary */
        bmpLength=0;
        length*=2;
    } else {
        /* some BMP, some supplementary */
        for (bmpLength=0; bmpLength<length && this->list[bmpLength]<=0xffff; ++bmpLength) {}
        length=bmpLength+2*(length-bmpLength);
    }
#ifdef DEBUG_SERIALIZE
    printf(">> bmpLength%d length%d len%d\n", bmpLength, length, len);
#endif
    /* length: number of 16-bit array units */
    if (length>0x7fff) {
        /* there are only 15 bits for the length in the first serialized word */
        ec=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    /*
     * total serialized length:
     * number of 16-bit array units (length) +
     * 1 length unit (always) +
     * 1 bmpLength unit (if there are supplementary values)
     */
    destLength=length+((length>bmpLength)?2:1);
    if (destLength<=destCapacity) {
        const UChar32 *p;
        int32_t i;

#ifdef DEBUG_SERIALIZE
        printf("writeHdr\n");
#endif
        *dest=(uint16_t)length;
        if (length>bmpLength) {
            *dest|=0x8000;
            *++dest=(uint16_t)bmpLength;
        }
        ++dest;

        /* write the BMP part of the array */
        p=this->list;
        for (i=0; i<bmpLength; ++i) {
#ifdef DEBUG_SERIALIZE
          printf("writebmp: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)*p++;
        }

        /* write the supplementary part of the array */
        for (; i<length; i+=2) {
#ifdef DEBUG_SERIALIZE
          printf("write32: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)(*p>>16);
            *dest++=(uint16_t)*p++;
        }
    } else {
        ec=U_BUFFER_OVERFLOW_ERROR;
    }
    return destLength;
}